

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

uint __thiscall UnifiedRegex::CharSetInner::Count(CharSetInner *this,uint level)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  uint local_1c;
  uint local_18;
  uint i;
  uint n;
  uint level_local;
  CharSetInner *this_local;
  
  local_18 = 0;
  if (level == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x281,"(level > 0)","level > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    if (this->children[local_1c] != (CharSetNode *)0x0) {
      iVar3 = (*this->children[local_1c]->_vptr_CharSetNode[0xb])
                        (this->children[local_1c],(ulong)(level - 1));
      local_18 = iVar3 + local_18;
    }
  }
  return local_18;
}

Assistant:

uint CharSetInner::Count(uint level) const
    {
        uint n = 0;
        Assert(level >  0);
        level--;
        for (uint i = 0; i < branchingPerInnerLevel; i++)
        {
            if (children[i] != nullptr)
                n += children[i]->Count(level);
        }
        return n;
    }